

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

void uv_walk(uv_loop_t *loop,uv_walk_cb walk_cb,void *arg)

{
  uv__queue *puVar1;
  uv__queue *puVar2;
  uv__queue *puVar3;
  uv__queue local_38;
  
  local_38.next = &local_38;
  puVar1 = &loop->handle_queue;
  puVar2 = (loop->handle_queue).next;
  if (puVar2 != puVar1) {
    local_38.prev = (loop->handle_queue).prev;
    (local_38.prev)->next = &local_38;
    puVar3 = puVar2->prev;
    (loop->handle_queue).prev = puVar3;
    puVar3->next = puVar1;
    local_38.next = puVar2;
  }
  (local_38.next)->prev = &local_38;
  while (local_38.next != &local_38) {
    (local_38.next)->prev->next = (local_38.next)->next;
    (local_38.next)->next->prev = (local_38.next)->prev;
    (local_38.next)->next = puVar1;
    puVar2 = (loop->handle_queue).prev;
    (local_38.next)->prev = puVar2;
    puVar2->next = local_38.next;
    (loop->handle_queue).prev = local_38.next;
    if (((ulong)local_38.next[1].prev & 0x10) == 0) {
      (*walk_cb)((uv_handle_t *)(local_38.next + -2),arg);
    }
  }
  return;
}

Assistant:

void uv_walk(uv_loop_t* loop, uv_walk_cb walk_cb, void* arg) {
  struct uv__queue queue;
  struct uv__queue* q;
  uv_handle_t* h;

  uv__queue_move(&loop->handle_queue, &queue);
  while (!uv__queue_empty(&queue)) {
    q = uv__queue_head(&queue);
    h = uv__queue_data(q, uv_handle_t, handle_queue);

    uv__queue_remove(q);
    uv__queue_insert_tail(&loop->handle_queue, q);

    if (h->flags & UV_HANDLE_INTERNAL) continue;
    walk_cb(h, arg);
  }
}